

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O0

unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> __thiscall
cmm::BinaryOperatorAST::tryFoldBinOpRelation
          (BinaryOperatorAST *this,TokenKind TokenKind,
          unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *LHS,
          unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *RHS)

{
  TokenKind TokenKind_00;
  bool bVar1;
  __type Value;
  pointer pEVar2;
  IntAST *pIVar3;
  StringAST *pSVar4;
  string *psVar5;
  DoubleAST *pDVar6;
  BoolAST *pBVar7;
  unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> local_170;
  unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> local_168;
  unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_> local_160;
  unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_> local_158;
  unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_> local_150;
  unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_> local_148;
  unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_> local_140;
  unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_> local_138;
  byte local_12a;
  byte local_129;
  bool R_3;
  bool L_3;
  unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_> local_120;
  unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_> local_118;
  unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_> local_110;
  unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_> local_108;
  unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_> local_100;
  double local_f8;
  double R_2;
  double L_2;
  unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_> local_e0;
  unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_> local_d8;
  unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_> local_d0;
  unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_> local_c8;
  int local_bc;
  unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_> local_b8;
  undefined1 local_b0 [8];
  string R_1;
  string L_1;
  unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_> local_68;
  unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_> local_60;
  unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_> local_58;
  unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_> local_50 [3];
  unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_> local_38;
  int local_30;
  int local_2c;
  int R;
  int L;
  unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *RHS_local;
  unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *LHS_local;
  BinaryOperatorAST *pBStack_10;
  TokenKind TokenKind_local;
  
  _R = RHS;
  RHS_local = LHS;
  LHS_local._4_4_ = TokenKind;
  pBStack_10 = this;
  pEVar2 = std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::operator->
                     (LHS);
  bVar1 = ExpressionAST::isInt(pEVar2);
  if (bVar1) {
    pEVar2 = std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::
             operator->(RHS);
    bVar1 = ExpressionAST::isInt(pEVar2);
    if (bVar1) {
      pEVar2 = std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::
               operator->(LHS);
      pIVar3 = ExpressionAST::as_cptr<cmm::IntAST>(pEVar2);
      local_2c = IntAST::getValue(pIVar3);
      pEVar2 = std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::
               operator->(RHS);
      pIVar3 = ExpressionAST::as_cptr<cmm::IntAST>(pEVar2);
      local_30 = IntAST::getValue(pIVar3);
      switch(LHS_local._4_4_) {
      case Less:
        pBVar7 = (BoolAST *)operator_new(0x10);
        BoolAST::BoolAST(pBVar7,local_2c < local_30);
        std::unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>>::
        unique_ptr<std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>> *)&local_38,pBVar7);
        std::unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>>::
        unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>> *)this,
                   &local_38);
        std::unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_>::~unique_ptr(&local_38);
        return (__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                )(__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                  )this;
      case LessEqual:
        pBVar7 = (BoolAST *)operator_new(0x10);
        BoolAST::BoolAST(pBVar7,local_2c <= local_30);
        std::unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>>::
        unique_ptr<std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>> *)local_50,pBVar7);
        std::unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>>::
        unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>> *)this,
                   local_50);
        std::unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_>::~unique_ptr(local_50);
        return (__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                )(__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                  )this;
      case EqualEqual:
        pBVar7 = (BoolAST *)operator_new(0x10);
        BoolAST::BoolAST(pBVar7,local_2c == local_30);
        std::unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>>::
        unique_ptr<std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>> *)&local_58,pBVar7);
        std::unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>>::
        unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>> *)this,
                   &local_58);
        std::unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_>::~unique_ptr(&local_58);
        return (__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                )(__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                  )this;
      case ExclaimEqual:
        pBVar7 = (BoolAST *)operator_new(0x10);
        BoolAST::BoolAST(pBVar7,local_2c != local_30);
        std::unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>>::
        unique_ptr<std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>> *)&local_60,pBVar7);
        std::unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>>::
        unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>> *)this,
                   &local_60);
        std::unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_>::~unique_ptr(&local_60);
        return (__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                )(__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                  )this;
      case Greater:
        pBVar7 = (BoolAST *)operator_new(0x10);
        BoolAST::BoolAST(pBVar7,local_30 < local_2c);
        std::unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>>::
        unique_ptr<std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>> *)
                   (L_1.field_2._M_local_buf + 8),pBVar7);
        std::unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>>::
        unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>> *)this,
                   (unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_> *)
                   ((long)&L_1.field_2 + 8));
        std::unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_>::~unique_ptr
                  ((unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_> *)
                   ((long)&L_1.field_2 + 8));
        return (__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                )(__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                  )this;
      case GreaterEqual:
        pBVar7 = (BoolAST *)operator_new(0x10);
        BoolAST::BoolAST(pBVar7,local_30 <= local_2c);
        std::unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>>::
        unique_ptr<std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>> *)&local_68,pBVar7);
        std::unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>>::
        unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>> *)this,
                   &local_68);
        std::unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_>::~unique_ptr(&local_68);
        return (__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                )(__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                  )this;
      }
    }
  }
  pEVar2 = std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::operator->
                     (LHS);
  bVar1 = ExpressionAST::isString(pEVar2);
  if (bVar1) {
    pEVar2 = std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::
             operator->(RHS);
    bVar1 = ExpressionAST::isString(pEVar2);
    if (bVar1) {
      pEVar2 = std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::
               operator->(LHS);
      pSVar4 = ExpressionAST::as_cptr<cmm::StringAST>(pEVar2);
      psVar5 = StringAST::getValue_abi_cxx11_(pSVar4);
      std::__cxx11::string::string((string *)(R_1.field_2._M_local_buf + 8),(string *)psVar5);
      pEVar2 = std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::
               operator->(RHS);
      pSVar4 = ExpressionAST::as_cptr<cmm::StringAST>(pEVar2);
      psVar5 = StringAST::getValue_abi_cxx11_(pSVar4);
      std::__cxx11::string::string((string *)local_b0,(string *)psVar5);
      switch(LHS_local._4_4_) {
      case Less:
        pBVar7 = (BoolAST *)operator_new(0x10);
        bVar1 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&R_1.field_2 + 8),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_b0);
        BoolAST::BoolAST(pBVar7,bVar1);
        std::unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>>::
        unique_ptr<std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>> *)&local_b8,pBVar7);
        std::unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>>::
        unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>> *)this,
                   &local_b8);
        std::unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_>::~unique_ptr(&local_b8);
        local_bc = 1;
        break;
      case LessEqual:
        pBVar7 = (BoolAST *)operator_new(0x10);
        bVar1 = std::operator<=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&R_1.field_2 + 8),
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_b0);
        BoolAST::BoolAST(pBVar7,bVar1);
        std::unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>>::
        unique_ptr<std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>> *)&local_c8,pBVar7);
        std::unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>>::
        unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>> *)this,
                   &local_c8);
        std::unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_>::~unique_ptr(&local_c8);
        local_bc = 1;
        break;
      case EqualEqual:
        pBVar7 = (BoolAST *)operator_new(0x10);
        Value = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&R_1.field_2 + 8),
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_b0);
        BoolAST::BoolAST(pBVar7,Value);
        std::unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>>::
        unique_ptr<std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>> *)&local_d0,pBVar7);
        std::unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>>::
        unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>> *)this,
                   &local_d0);
        std::unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_>::~unique_ptr(&local_d0);
        local_bc = 1;
        break;
      case ExclaimEqual:
        pBVar7 = (BoolAST *)operator_new(0x10);
        bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&R_1.field_2 + 8),
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_b0);
        BoolAST::BoolAST(pBVar7,bVar1);
        std::unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>>::
        unique_ptr<std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>> *)&local_d8,pBVar7);
        std::unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>>::
        unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>> *)this,
                   &local_d8);
        std::unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_>::~unique_ptr(&local_d8);
        local_bc = 1;
        break;
      case Greater:
        pBVar7 = (BoolAST *)operator_new(0x10);
        bVar1 = std::operator>((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&R_1.field_2 + 8),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_b0);
        BoolAST::BoolAST(pBVar7,bVar1);
        std::unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>>::
        unique_ptr<std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>> *)&L_2,pBVar7);
        std::unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>>::
        unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>> *)this,
                   (unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_> *)&L_2);
        std::unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_>::~unique_ptr
                  ((unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_> *)&L_2);
        local_bc = 1;
        break;
      case GreaterEqual:
        pBVar7 = (BoolAST *)operator_new(0x10);
        bVar1 = std::operator>=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&R_1.field_2 + 8),
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_b0);
        BoolAST::BoolAST(pBVar7,bVar1);
        std::unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>>::
        unique_ptr<std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>> *)&local_e0,pBVar7);
        std::unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>>::
        unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>> *)this,
                   &local_e0);
        std::unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_>::~unique_ptr(&local_e0);
        local_bc = 1;
        break;
      default:
        local_bc = 0;
      }
      std::__cxx11::string::~string((string *)local_b0);
      std::__cxx11::string::~string((string *)(R_1.field_2._M_local_buf + 8));
      if (local_bc != 0) {
        return (__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                )(__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                  )this;
      }
    }
  }
  pEVar2 = std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::operator->
                     (LHS);
  bVar1 = ExpressionAST::isDouble(pEVar2);
  if (bVar1) {
    pEVar2 = std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::
             operator->(RHS);
    bVar1 = ExpressionAST::isDouble(pEVar2);
    if (bVar1) {
      pEVar2 = std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::
               operator->(LHS);
      pDVar6 = ExpressionAST::as_cptr<cmm::DoubleAST>(pEVar2);
      R_2 = DoubleAST::getValue(pDVar6);
      pEVar2 = std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::
               operator->(RHS);
      pDVar6 = ExpressionAST::as_cptr<cmm::DoubleAST>(pEVar2);
      local_f8 = DoubleAST::getValue(pDVar6);
      switch(LHS_local._4_4_) {
      case Less:
        pBVar7 = (BoolAST *)operator_new(0x10);
        BoolAST::BoolAST(pBVar7,R_2 < local_f8);
        std::unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>>::
        unique_ptr<std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>> *)&local_100,pBVar7);
        std::unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>>::
        unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>> *)this,
                   &local_100);
        std::unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_>::~unique_ptr(&local_100);
        return (__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                )(__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                  )this;
      case LessEqual:
        pBVar7 = (BoolAST *)operator_new(0x10);
        BoolAST::BoolAST(pBVar7,R_2 <= local_f8);
        std::unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>>::
        unique_ptr<std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>> *)&local_108,pBVar7);
        std::unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>>::
        unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>> *)this,
                   &local_108);
        std::unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_>::~unique_ptr(&local_108);
        return (__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                )(__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                  )this;
      case EqualEqual:
        pBVar7 = (BoolAST *)operator_new(0x10);
        BoolAST::BoolAST(pBVar7,(bool)(-(R_2 == local_f8) & 1));
        std::unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>>::
        unique_ptr<std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>> *)&local_110,pBVar7);
        std::unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>>::
        unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>> *)this,
                   &local_110);
        std::unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_>::~unique_ptr(&local_110);
        return (__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                )(__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                  )this;
      case ExclaimEqual:
        pBVar7 = (BoolAST *)operator_new(0x10);
        BoolAST::BoolAST(pBVar7,(bool)(-(R_2 != local_f8) & 1));
        std::unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>>::
        unique_ptr<std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>> *)&local_118,pBVar7);
        std::unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>>::
        unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>> *)this,
                   &local_118);
        std::unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_>::~unique_ptr(&local_118);
        return (__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                )(__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                  )this;
      case Greater:
        pBVar7 = (BoolAST *)operator_new(0x10);
        BoolAST::BoolAST(pBVar7,local_f8 < R_2);
        std::unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>>::
        unique_ptr<std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>> *)
                   &stack0xfffffffffffffed8,pBVar7);
        std::unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>>::
        unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>> *)this,
                   (unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_> *)
                   &stack0xfffffffffffffed8);
        std::unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_>::~unique_ptr
                  ((unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_> *)
                   &stack0xfffffffffffffed8);
        return (__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                )(__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                  )this;
      case GreaterEqual:
        pBVar7 = (BoolAST *)operator_new(0x10);
        BoolAST::BoolAST(pBVar7,local_f8 <= R_2);
        std::unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>>::
        unique_ptr<std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>> *)&local_120,pBVar7);
        std::unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>>::
        unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>> *)this,
                   &local_120);
        std::unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_>::~unique_ptr(&local_120);
        return (__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                )(__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                  )this;
      }
    }
  }
  pEVar2 = std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::operator->
                     (LHS);
  bVar1 = ExpressionAST::isBool(pEVar2);
  if (bVar1) {
    pEVar2 = std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::
             operator->(RHS);
    bVar1 = ExpressionAST::isBool(pEVar2);
    if (bVar1) {
      pEVar2 = std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::
               operator->(LHS);
      pBVar7 = ExpressionAST::as_cptr<cmm::BoolAST>(pEVar2);
      local_129 = BoolAST::getValue(pBVar7);
      pEVar2 = std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::
               operator->(RHS);
      pBVar7 = ExpressionAST::as_cptr<cmm::BoolAST>(pEVar2);
      local_12a = BoolAST::getValue(pBVar7);
      switch(LHS_local._4_4_) {
      case Less:
        pBVar7 = (BoolAST *)operator_new(0x10);
        BoolAST::BoolAST(pBVar7,(local_129 & 1) < (local_12a & 1));
        std::unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>>::
        unique_ptr<std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>> *)&local_138,pBVar7);
        std::unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>>::
        unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>> *)this,
                   &local_138);
        std::unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_>::~unique_ptr(&local_138);
        return (__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                )(__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                  )this;
      case LessEqual:
        pBVar7 = (BoolAST *)operator_new(0x10);
        BoolAST::BoolAST(pBVar7,(local_129 & 1) <= (local_12a & 1));
        std::unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>>::
        unique_ptr<std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>> *)&local_140,pBVar7);
        std::unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>>::
        unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>> *)this,
                   &local_140);
        std::unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_>::~unique_ptr(&local_140);
        return (__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                )(__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                  )this;
      case EqualEqual:
        pBVar7 = (BoolAST *)operator_new(0x10);
        BoolAST::BoolAST(pBVar7,(local_129 & 1) == (local_12a & 1));
        std::unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>>::
        unique_ptr<std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>> *)&local_148,pBVar7);
        std::unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>>::
        unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>> *)this,
                   &local_148);
        std::unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_>::~unique_ptr(&local_148);
        return (__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                )(__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                  )this;
      case ExclaimEqual:
        pBVar7 = (BoolAST *)operator_new(0x10);
        BoolAST::BoolAST(pBVar7,(local_129 & 1) != (local_12a & 1));
        std::unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>>::
        unique_ptr<std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>> *)&local_150,pBVar7);
        std::unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>>::
        unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>> *)this,
                   &local_150);
        std::unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_>::~unique_ptr(&local_150);
        return (__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                )(__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                  )this;
      case Greater:
        pBVar7 = (BoolAST *)operator_new(0x10);
        BoolAST::BoolAST(pBVar7,(local_12a & 1) < (local_129 & 1));
        std::unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>>::
        unique_ptr<std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>> *)&local_160,pBVar7);
        std::unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>>::
        unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>> *)this,
                   &local_160);
        std::unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_>::~unique_ptr(&local_160);
        return (__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                )(__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                  )this;
      case GreaterEqual:
        pBVar7 = (BoolAST *)operator_new(0x10);
        BoolAST::BoolAST(pBVar7,(local_12a & 1) <= (local_129 & 1));
        std::unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>>::
        unique_ptr<std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>> *)&local_158,pBVar7);
        std::unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>>::
        unique_ptr<cmm::BoolAST,std::default_delete<cmm::BoolAST>,void>
                  ((unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>> *)this,
                   &local_158);
        std::unique_ptr<cmm::BoolAST,_std::default_delete<cmm::BoolAST>_>::~unique_ptr(&local_158);
        return (__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                )(__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                  )this;
      }
    }
  }
  TokenKind_00 = LHS_local._4_4_;
  std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::unique_ptr
            (&local_168,LHS);
  std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::unique_ptr
            (&local_170,RHS);
  create(this,TokenKind_00,&local_168,&local_170);
  std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::~unique_ptr
            (&local_170);
  std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::~unique_ptr
            (&local_168);
  return (__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>)
         (__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<ExpressionAST>
BinaryOperatorAST::tryFoldBinOpRelation(Token::TokenKind TokenKind,
                                        std::unique_ptr<ExpressionAST> LHS,
                                        std::unique_ptr<ExpressionAST> RHS) {

#define CASE(TOKEN_KIND, OPERATOR)                                             \
  case Token::TOKEN_KIND:                                                      \
    return std::unique_ptr<BoolAST>(new BoolAST(L OPERATOR R))

#define TRY_COMPARE(type, Type)                                                \
  do {                                                                         \
    if (LHS->is##Type() && RHS->is##Type()) {                                  \
      type L = LHS->as_cptr<Type##AST>()->getValue();                          \
      type R = RHS->as_cptr<Type##AST>()->getValue();                          \
      switch (TokenKind) {                                                     \
      default: break;                                                          \
      CASE(Less, <);                                                           \
      CASE(LessEqual, <=);                                                     \
      CASE(EqualEqual, ==);                                                    \
      CASE(ExclaimEqual, !=);                                                  \
      CASE(GreaterEqual, >=);                                                  \
      CASE(Greater, >);                                                        \
      }                                                                        \
    }                                                                          \
  } while (0)

  TRY_COMPARE(int, Int);
  TRY_COMPARE(std::string, String);
  TRY_COMPARE(double, Double);
  TRY_COMPARE(bool, Bool);

#undef TRY_COMPARE
#undef CASE

  // TODO: Not very elegant, but this is ok.
  return BinaryOperatorAST::create(TokenKind, std::move(LHS), std::move(RHS));
}